

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

int detect_flash(TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,int offset)

{
  double dVar1;
  uint uVar2;
  FIRSTPASS_STATS *pFVar3;
  
  pFVar3 = read_frame_stats(twopass,twopass_frame,offset);
  uVar2 = 0;
  if ((pFVar3 != (FIRSTPASS_STATS *)0x0) &&
     (dVar1 = pFVar3->pcnt_second_ref, pFVar3->pcnt_inter <= dVar1 && dVar1 != pFVar3->pcnt_inter))
  {
    uVar2 = (uint)(0.5 <= dVar1);
  }
  return uVar2;
}

Assistant:

static int detect_flash(const TWO_PASS *twopass,
                        const TWO_PASS_FRAME *twopass_frame, const int offset) {
  const FIRSTPASS_STATS *const next_frame =
      read_frame_stats(twopass, twopass_frame, offset);

  // What we are looking for here is a situation where there is a
  // brief break in prediction (such as a flash) but subsequent frames
  // are reasonably well predicted by an earlier (pre flash) frame.
  // The recovery after a flash is indicated by a high pcnt_second_ref
  // compared to pcnt_inter.
  return next_frame != NULL &&
         next_frame->pcnt_second_ref > next_frame->pcnt_inter &&
         next_frame->pcnt_second_ref >= 0.5;
}